

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDFace * __thiscall ON_SubD::FaceFromId(ON_SubD *this,uint face_id)

{
  element_type *peVar1;
  ON_SubDFace *pOVar2;
  
  if ((1 < face_id + 1) &&
     (peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    pOVar2 = ON_SubDHeap::FaceFromId(&peVar1->m_heap,face_id);
    return pOVar2;
  }
  return (ON_SubDFace *)0x0;
}

Assistant:

const class ON_SubDFace* ON_SubD::FaceFromId(
  unsigned int face_id
  ) const
{
  for (;;)
  {
    if (0 == face_id || ON_UNSET_UINT_INDEX == face_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->FaceFromId(face_id);
  }
  return nullptr;
}